

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void __thiscall google::FlagSaverImpl::~FlagSaverImpl(FlagSaverImpl *this)

{
  CommandLineFlag *this_00;
  pointer ppCVar1;
  
  for (ppCVar1 = (this->backup_registry_).
                 super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar1 !=
      (this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppCVar1 = ppCVar1 + 1) {
    this_00 = *ppCVar1;
    if (this_00 != (CommandLineFlag *)0x0) {
      anon_unknown_1::CommandLineFlag::~CommandLineFlag(this_00);
    }
    operator_delete(this_00);
  }
  ppCVar1 = (this->backup_registry_).
            super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar1 != (pointer)0x0) {
    operator_delete(ppCVar1);
    return;
  }
  return;
}

Assistant:

~FlagSaverImpl() {
    // reclaim memory from each of our CommandLineFlags
    vector<CommandLineFlag*>::const_iterator it;
    for (it = backup_registry_.begin(); it != backup_registry_.end(); ++it)
      delete *it;
  }